

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a7920 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a7927._0_1_ = '.';
    uRam00000000001a7927._1_1_ = '.';
    uRam00000000001a7927._2_1_ = '.';
    uRam00000000001a7927._3_1_ = '.';
    uRam00000000001a7927._4_1_ = '.';
    uRam00000000001a7927._5_1_ = '.';
    uRam00000000001a7927._6_1_ = '.';
    uRam00000000001a7927._7_1_ = '.';
    DAT_001a7910 = '.';
    DAT_001a7910_1._0_1_ = '.';
    DAT_001a7910_1._1_1_ = '.';
    DAT_001a7910_1._2_1_ = '.';
    DAT_001a7910_1._3_1_ = '.';
    DAT_001a7910_1._4_1_ = '.';
    DAT_001a7910_1._5_1_ = '.';
    DAT_001a7910_1._6_1_ = '.';
    uRam00000000001a7918 = 0x2e2e2e2e2e2e2e;
    DAT_001a791f = 0x2e;
    DAT_001a7900 = '.';
    DAT_001a7900_1._0_1_ = '.';
    DAT_001a7900_1._1_1_ = '.';
    DAT_001a7900_1._2_1_ = '.';
    DAT_001a7900_1._3_1_ = '.';
    DAT_001a7900_1._4_1_ = '.';
    DAT_001a7900_1._5_1_ = '.';
    DAT_001a7900_1._6_1_ = '.';
    uRam00000000001a7908._0_1_ = '.';
    uRam00000000001a7908._1_1_ = '.';
    uRam00000000001a7908._2_1_ = '.';
    uRam00000000001a7908._3_1_ = '.';
    uRam00000000001a7908._4_1_ = '.';
    uRam00000000001a7908._5_1_ = '.';
    uRam00000000001a7908._6_1_ = '.';
    uRam00000000001a7908._7_1_ = '.';
    DAT_001a78f0 = '.';
    DAT_001a78f0_1._0_1_ = '.';
    DAT_001a78f0_1._1_1_ = '.';
    DAT_001a78f0_1._2_1_ = '.';
    DAT_001a78f0_1._3_1_ = '.';
    DAT_001a78f0_1._4_1_ = '.';
    DAT_001a78f0_1._5_1_ = '.';
    DAT_001a78f0_1._6_1_ = '.';
    uRam00000000001a78f8._0_1_ = '.';
    uRam00000000001a78f8._1_1_ = '.';
    uRam00000000001a78f8._2_1_ = '.';
    uRam00000000001a78f8._3_1_ = '.';
    uRam00000000001a78f8._4_1_ = '.';
    uRam00000000001a78f8._5_1_ = '.';
    uRam00000000001a78f8._6_1_ = '.';
    uRam00000000001a78f8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a78e8._0_1_ = '.';
    uRam00000000001a78e8._1_1_ = '.';
    uRam00000000001a78e8._2_1_ = '.';
    uRam00000000001a78e8._3_1_ = '.';
    uRam00000000001a78e8._4_1_ = '.';
    uRam00000000001a78e8._5_1_ = '.';
    uRam00000000001a78e8._6_1_ = '.';
    uRam00000000001a78e8._7_1_ = '.';
    DAT_001a792f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}